

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O1

ON_XMLNode * FindPostEffectNodeForId(ON_XMLNode *pep_section_node,ON_UUID *id)

{
  bool bVar1;
  int iVar2;
  ON_XMLNode *pOVar3;
  undefined4 extraout_var;
  long *plVar4;
  ON_XMLNode *this;
  ON_UUID_struct OVar5;
  ChildIterator it;
  undefined1 local_50 [16];
  ON_UUID_struct local_40;
  
  this = (ON_XMLNode *)local_50;
  (*pep_section_node->_vptr_ON_XMLNode[0x2c])(this,pep_section_node);
  pOVar3 = ON_XMLNode::ChildIterator::GetNextChild((ChildIterator *)this);
  do {
    if (pOVar3 == (ON_XMLNode *)0x0) {
      this = (ON_XMLNode *)0x0;
      break;
    }
    iVar2 = (*pOVar3->_vptr_ON_XMLNode[0x26])(pOVar3,L"id");
    plVar4 = (long *)CONCAT44(extraout_var,iVar2);
    if (plVar4 == (long *)0x0) {
LAB_0059cdab:
      pOVar3 = ON_XMLNode::ChildIterator::GetNextChild((ChildIterator *)local_50);
      bVar1 = true;
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x38))(plVar4);
      OVar5 = (ON_UUID_struct)(**(code **)(*plVar4 + 0x138))(plVar4);
      local_40 = OVar5;
      bVar1 = operator==(&local_40,id);
      if (!bVar1) goto LAB_0059cdab;
      bVar1 = false;
      this = pOVar3;
    }
  } while (bVar1);
  ON_XMLNode::ChildIterator::~ChildIterator((ChildIterator *)local_50);
  return this;
}

Assistant:

ON_XMLNode* FindPostEffectNodeForId(const ON_XMLNode& pep_section_node, const ON_UUID& id)
{
  auto it = pep_section_node.GetChildIterator();

  auto* pep_node = it.GetNextChild();
  while (nullptr != pep_node)
  {
    const auto* prop = pep_node->GetNamedProperty(ON_RDK_PEP_ID);
    if (nullptr != prop)
    {
      if (prop->GetValue().AsUuid() == id)
        return pep_node;
    }

    pep_node = it.GetNextChild();
  }

  return nullptr;
}